

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schedule.hpp
# Opt level: O3

pair<std::shared_ptr<Schedule>,_int> *
Schedule::fromFile(pair<std::shared_ptr<Schedule>,_int> *__return_storage_ptr__,string *path)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  pointer pOVar8;
  reference json_00;
  undefined8 extraout_RAX;
  int id;
  _Alloc_hider *__r;
  TaskHandle task;
  json json;
  iterator __begin1;
  iterator __end1;
  ifstream file;
  element_type *local_2d8;
  _Alloc_hider a_Stack_2d0 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2c0;
  element_type *local_2b8;
  _Alloc_hider local_2b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2a8;
  undefined1 local_2a0 [16];
  string *local_290;
  pointer local_288;
  pointer local_280;
  undefined1 local_278 [32];
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_258;
  istream local_238 [520];
  
  std::ifstream::ifstream(local_238,(string *)path,_S_in);
  local_2a0[0] = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  )0x0;
  local_2a0._8_8_ = (object_t *)0x0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_2a0);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_2a0);
  nlohmann::operator>>
            (local_238,
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)local_2a0);
  p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
  p_Var7->_M_use_count = 1;
  p_Var7->_M_weak_count = 1;
  p_Var7->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00142b98;
  p_Var7[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var7[1]._M_use_count = 0;
  p_Var7[1]._M_weak_count = 0;
  p_Var7[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var7[2]._M_use_count = 0;
  p_Var7[2]._M_weak_count = 0;
  p_Var7[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var7[3]._M_use_count = 0;
  p_Var7[3]._M_weak_count = 0;
  p_Var7[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var7[4]._M_use_count = 0;
  p_Var7[4]._M_weak_count = 0;
  p_Var7[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var7[5]._M_use_count = 0;
  p_Var7[5]._M_weak_count = 0;
  p_Var7[6]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var7[6]._M_use_count = 0;
  p_Var7[6]._M_weak_count = 0;
  Common::fromJson((Common *)local_278,(json *)local_2a0);
  uVar4 = local_278._8_8_;
  uVar3 = local_278._0_8_;
  local_278._0_8_ = (pointer)0x0;
  local_278._8_8_ = (_Base_ptr)0x0;
  uVar5 = local_278._8_8_;
  p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&p_Var7[1]._M_use_count;
  p_Var7[1]._vptr__Sp_counted_base = (_func_int **)uVar3;
  local_278._8_4_ = (undefined4)uVar4;
  local_278._12_4_ = SUB84(uVar4,4);
  p_Var7[1]._M_use_count = local_278._8_4_;
  p_Var7[1]._M_weak_count = local_278._12_4_;
  local_278._8_8_ = uVar5;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    if ((_Base_ptr)local_278._8_8_ != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_);
    }
  }
  local_2d8 = (element_type *)0x0;
  a_Stack_2d0[0]._M_p = (pointer)0x0;
  local_2a8 = p_Var7;
  local_290 = path;
  local_288 = (pointer)__return_storage_ptr__;
  pOVar8 = (pointer)nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                *)local_2a0,"code");
  peVar1 = (element_type *)(p_Var7 + 1);
  local_278._8_8_ = (_Base_ptr)0x0;
  local_278._16_8_ =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        *)0x0;
  local_278._24_8_ = -0x8000000000000000;
  local_278._0_8_ = pOVar8;
  nlohmann::detail::
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::set_begin((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *)local_278);
  local_258.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_258.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        *)0x0;
  local_258.m_it.primitive_iterator.m_it = -0x8000000000000000;
  local_258.m_object = (pointer)pOVar8;
  nlohmann::detail::
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::set_end(&local_258);
  local_2c0 = p_Var7 + 2;
  local_280 = (pointer)&p_Var7[2]._M_use_count;
  id = 0;
  while( true ) {
    bVar6 = nlohmann::detail::
            iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)local_278,&local_258);
    if (bVar6) break;
    json_00 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           *)local_278);
    id = id + 1;
    Task::fromJson((Task *)&local_2b8,id,
                   &((peVar1->common).super___shared_ptr<Common,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->operands,json_00);
    if (local_2d8 == (element_type *)0x0) {
      ((__shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2> *)&local_2c0->_vptr__Sp_counted_base)->_M_ptr
           = local_2b8;
      __r = &local_2b0;
      pOVar8 = local_280;
    }
    else {
      (local_2d8->next).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_2b8;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(local_2d8->next).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2b0);
      (local_2b8->prev).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_2d8;
      __r = a_Stack_2d0;
      pOVar8 = (pointer)&(local_2b8->prev).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)pOVar8,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)__r);
    local_2d8 = local_2b8;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)a_Stack_2d0,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2b0);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b0._M_p !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b0._M_p);
    }
    nlohmann::detail::
    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator++((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)local_278);
  }
  (local_2d8->next).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  p_Var2 = (local_2d8->next).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (local_2d8->next).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = local_2c0;
  Common::recordAttributes
            ((peVar1->common).super___shared_ptr<Common,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (TaskHandle *)local_2c0);
  Common::analyzePlacement
            ((peVar1->common).super___shared_ptr<Common,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (TaskHandle *)p_Var2);
  bVar6 = Common::check((peVar1->common).super___shared_ptr<Common,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,(TaskHandle *)p_Var2);
  p_Var2 = local_2c0;
  if (bVar6) {
    Common::analyzeShare
              ((peVar1->common).super___shared_ptr<Common,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (TaskHandle *)local_2c0);
    Common::refactor((TaskHandle *)p_Var2);
    pOVar8 = local_288;
    p_Var2 = local_2a8;
    ((__shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2> *)
    &(local_288->operand).super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>)->_M_ptr = peVar1;
    (((__shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2> *)
     &(local_288->operand).super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>)->_M_refcount).
    _M_pi = local_2a8;
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_2a8->_M_use_count = local_2a8->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_2a8->_M_use_count = local_2a8->_M_use_count + 1;
    }
    *(int *)&local_288->version = id;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)a_Stack_2d0[0]._M_p !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)a_Stack_2d0[0]._M_p);
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)local_2a0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::json_value::destroy((json_value *)(local_2a0 + 8),local_2a0[0]);
    std::ifstream::~ifstream(local_238);
    return (pair<std::shared_ptr<Schedule>,_int> *)pOVar8;
  }
  error("Origin schedule in file %s check failed.",(local_290->_M_dataplus)._M_p);
  p_Var2 = local_2a8;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)a_Stack_2d0[0]._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)a_Stack_2d0[0]._M_p);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)local_2a0);
  std::ifstream::~ifstream(local_238);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

static std::pair<ScheduleHandle, int> fromFile(const std::string &path) {
        // Read JSON
        std::ifstream file(path);
        nlohmann::json json;
        file >> json;

        // Operands
        auto schedule = std::make_shared<Schedule>();
        schedule->common = Common::fromJson(json);

        // Records
        int count = 0;
        TaskHandle tail;
        for (auto &item: json["code"]) {
            auto task = Task::fromJson(++ count, schedule->common->operands, item);
            if (not tail) {
                schedule->head = task;
                tail = task;
            } else {
                tail->next = task;
                task->prev = tail;
                tail = task;
            }
        }
        tail->next = nullptr;

        // Analyze common elements and refactor to the format without .dealloc and .share
        schedule->common->recordAttributes(schedule->head);
        schedule->common->analyzePlacement(schedule->head);
        if (not schedule->common->check(schedule->head)) {
            error("Origin schedule in file %s check failed.", path.c_str());
        }
        schedule->common->analyzeShare(schedule->head);
        schedule->common->refactor(schedule->head);

        return std::make_pair(schedule, count);
    }